

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerEvaluationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte condition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  double dVar2;
  Variable y;
  Variable x;
  string *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  Variable *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string local_168 [36];
  undefined4 local_144;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [148];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x1294ce);
  Kandinsky::Variable::Variable((Variable *)0x1294db);
  Kandinsky::Variable::setValue
            ((Variable *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (double)in_stack_fffffffffffffe38);
  Kandinsky::Variable::setValue
            ((Variable *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (double)in_stack_fffffffffffffe38);
  Kandinsky::pow<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            ((Variable *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Kandinsky::PowerExpression::evaluate
                     ((PowerExpression *)
                      CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  Kandinsky::Variable::evaluate((Variable *)0x12956b);
  std::__cxx11::to_string((double)in_stack_fffffffffffffe48);
  std::operator+(in_stack_fffffffffffffe48,
                 (char *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  Kandinsky::Variable::evaluate((Variable *)0x1295b3);
  std::__cxx11::to_string((double)in_stack_fffffffffffffe48);
  std::operator+(in_stack_fffffffffffffe78,pbVar1);
  std::operator+(in_stack_fffffffffffffe48,
                 (char *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  Kandinsky::assertOrExit((bool)in_stack_fffffffffffffe47,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  Kandinsky::PowerExpression::~PowerExpression((PowerExpression *)0x129674);
  local_144 = 2;
  Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>
            ((Variable *)in_stack_fffffffffffffe78,(int *)pbVar1);
  dVar2 = Kandinsky::PowerExpression::evaluate
                    ((PowerExpression *)
                     CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  condition = -(dVar2 == 9.0) & 1;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Kandinsky::Variable::evaluate((Variable *)0x1296df);
  std::__cxx11::to_string((double)pbVar1);
  std::operator+(pbVar1,(char *)CONCAT17(condition,in_stack_fffffffffffffe40));
  Kandinsky::assertOrExit((bool)condition,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
  Kandinsky::PowerExpression::~PowerExpression((PowerExpression *)0x129748);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x129760);
  Kandinsky::Variable::~Variable((Variable *)0x12976d);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit(pow(x, y).evaluate() == 9, std::to_string(x.evaluate()) + " ^ " + std::to_string(y.evaluate()) + " != 9");
    assertOrExit(pow(x, 2).evaluate() == 9, std::to_string(x.evaluate()) + " ^ 2 != 9");
    return 0;
}